

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.h
# Opt level: O3

void __thiscall
acto::actor::fun_handler_t<msg_out,_acto::actor_ref,_const_msg_out_&>::fun_handler_t
          (fun_handler_t<msg_out,_acto::actor_ref,_const_msg_out_&> *this,F *func)

{
  undefined8 uVar1;
  
  (this->super_handler_t)._vptr_handler_t = (_func_int **)&PTR__fun_handler_t_0010e7e8;
  *(undefined8 *)&(this->func_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->func_).super__Function_base._M_functor + 8) = 0;
  (this->func_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->func_)._M_invoker = func->_M_invoker;
  if ((func->super__Function_base)._M_manager != (_Manager_type)0x0) {
    uVar1 = *(undefined8 *)((long)&(func->super__Function_base)._M_functor + 8);
    *(undefined8 *)&(this->func_).super__Function_base._M_functor =
         *(undefined8 *)&(func->super__Function_base)._M_functor;
    *(undefined8 *)((long)&(this->func_).super__Function_base._M_functor + 8) = uVar1;
    (this->func_).super__Function_base._M_manager = (func->super__Function_base)._M_manager;
    (func->super__Function_base)._M_manager = (_Manager_type)0x0;
    func->_M_invoker = (_Invoker_type)0x0;
    if ((this->func_).super__Function_base._M_manager != (_Manager_type)0x0) {
      return;
    }
  }
  __assert_fail("func_",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/artpaul[P]acto/include/acto/acto.h"
                ,0x165,
                "acto::actor::fun_handler_t<msg_out, acto::actor_ref, const msg_out &>::fun_handler_t(F &&) [M = msg_out, Args = <acto::actor_ref, const msg_out &>]"
               );
}

Assistant:

fun_handler_t(F&& func) noexcept
      : func_(std::move(func)) {
      assert(func_);
    }